

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

value_type * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::FindAndConstruct(DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                   *this,KeyID *Key)

{
  bool bVar1;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *TheBucket;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *local_20;
  
  bVar1 = LookupBucketFor<llbuild::core::KeyID>(this,Key,&local_20);
  if (!bVar1) {
    local_20 = DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>,llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>
               ::InsertIntoBucket<llbuild::core::KeyID_const&>
                         ((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>,llbuild::core::KeyID,DBKeyID,llvm::DenseMapInfo<llbuild::core::KeyID>,llvm::detail::DenseMapPair<llbuild::core::KeyID,DBKeyID>>
                           *)this,local_20,Key);
  }
  return local_20;
}

Assistant:

value_type& FindAndConstruct(const KeyT &Key) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return *TheBucket;

    return *InsertIntoBucket(TheBucket, Key);
  }